

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_sample.c
# Opt level: O2

_Bool al_set_default_mixer(ALLEGRO_MIXER *mixer)

{
  _Bool _Var1;
  char cVar2;
  undefined8 *puVar3;
  ALLEGRO_SAMPLE_INSTANCE *spl;
  char *pcVar4;
  int iVar5;
  
  _Var1 = true;
  if (default_mixer != mixer) {
    iVar5 = 0;
    default_mixer = mixer;
    do {
      if ((int)auto_samples._size <= iVar5) {
        return true;
      }
      puVar3 = (undefined8 *)_al_vector_ref(&auto_samples,iVar5);
      *(undefined4 *)(puVar3 + 1) = 0;
      al_destroy_sample_instance((ALLEGRO_SAMPLE_INSTANCE *)*puVar3);
      *(undefined1 *)((long)puVar3 + 0xc) = 0;
      spl = al_create_sample_instance((ALLEGRO_SAMPLE *)0x0);
      *puVar3 = spl;
      if (spl == (ALLEGRO_SAMPLE_INSTANCE *)0x0) {
        cVar2 = _al_trace_prefix("audio",3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/kcm_sample.c"
                                 ,0x120,"al_set_default_mixer");
        if (cVar2 == '\0') goto LAB_0010b4ac;
        pcVar4 = "al_create_sample failed\n";
        goto LAB_0010b4a5;
      }
      _Var1 = al_attach_sample_instance_to_mixer(spl,default_mixer);
      iVar5 = iVar5 + 1;
    } while (_Var1);
    cVar2 = _al_trace_prefix("audio",3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/kcm_sample.c"
                             ,0x124,"al_set_default_mixer");
    if (cVar2 != '\0') {
      pcVar4 = "al_attach_mixer_to_sample failed\n";
LAB_0010b4a5:
      _al_trace_suffix(pcVar4);
    }
LAB_0010b4ac:
    free_sample_vector();
    default_mixer = (ALLEGRO_MIXER *)0x0;
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool al_set_default_mixer(ALLEGRO_MIXER *mixer)
{
   ASSERT(mixer != NULL);

   if (mixer != default_mixer) {
      int i;

      default_mixer = mixer;

      /* Destroy all current sample instances, recreate them, and
       * attach them to the new mixer */
      for (i = 0; i < (int) _al_vector_size(&auto_samples); i++) {
         AUTO_SAMPLE *slot = _al_vector_ref(&auto_samples, i);

         slot->id = 0;
         al_destroy_sample_instance(slot->instance);
         slot->locked = false;

         slot->instance = al_create_sample_instance(NULL);
         if (!slot->instance) {
            ALLEGRO_ERROR("al_create_sample failed\n");
            goto Error;
         }
         if (!al_attach_sample_instance_to_mixer(slot->instance, default_mixer)) {
            ALLEGRO_ERROR("al_attach_mixer_to_sample failed\n");
            goto Error;
         }
      }      
   }

   return true;

Error:
   free_sample_vector();
   default_mixer = NULL;   
   return false;
}